

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void findConstInWhere(WhereConst *pConst,Expr *pExpr)

{
  Expr *pExpr_00;
  CollSeq *pCVar1;
  Expr *pValue;
  Expr *pEVar2;
  Walker local_50;
  
  if (pExpr != (Expr *)0x0) {
    while ((pExpr->flags & 1) == 0) {
      if (pExpr->op != ',') {
        if (pExpr->op != '5') {
          return;
        }
        pExpr_00 = pExpr->pLeft;
        pEVar2 = pExpr->pRight;
        if ((pEVar2->op == 0x9e) && ((pEVar2->flags & 8) == 0)) {
          local_50.eCode = '\x01';
          local_50.xExprCallback = exprNodeIsConstant;
          local_50.xSelectCallback = sqlite3SelectWalkFail;
          local_50.u.n = 0;
          if (((pExpr_00 == (Expr *)0x0) || (walkExpr(&local_50,pExpr_00), local_50.eCode != '\0'))
             && ((pCVar1 = sqlite3BinaryCompareCollSeq(pConst->pParse,pExpr_00,pEVar2),
                 pValue = pExpr_00, pCVar1 == (CollSeq *)0x0 ||
                 ((pCVar1->xCmp == binCollFunc && (pCVar1->pUser == (void *)0x0))))))
          goto LAB_0017946c;
        }
        if (pExpr_00->op != 0x9e) {
          return;
        }
        if ((pExpr_00->flags & 8) != 0) {
          return;
        }
        local_50.eCode = '\x01';
        local_50.xExprCallback = exprNodeIsConstant;
        local_50.xSelectCallback = sqlite3SelectWalkFail;
        local_50.u.n = 0;
        walkExpr(&local_50,pEVar2);
        if (local_50.eCode == '\0') {
          return;
        }
        pCVar1 = sqlite3BinaryCompareCollSeq(pConst->pParse,pExpr_00,pEVar2);
        pValue = pEVar2;
        pEVar2 = pExpr_00;
        if (pCVar1 != (CollSeq *)0x0) {
          if (pCVar1->xCmp != binCollFunc) {
            return;
          }
          if (pCVar1->pUser != (void *)0x0) {
            return;
          }
        }
LAB_0017946c:
        constInsert(pConst,pEVar2,pValue);
        return;
      }
      findConstInWhere(pConst,pExpr->pRight);
      pExpr = pExpr->pLeft;
      if (pExpr == (Expr *)0x0) {
        return;
      }
    }
  }
  return;
}

Assistant:

static void findConstInWhere(WhereConst *pConst, Expr *pExpr){
  Expr *pRight, *pLeft;
  if( pExpr==0 ) return;
  if( ExprHasProperty(pExpr, EP_FromJoin) ) return;
  if( pExpr->op==TK_AND ){
    findConstInWhere(pConst, pExpr->pRight);
    findConstInWhere(pConst, pExpr->pLeft);
    return;
  }
  if( pExpr->op!=TK_EQ ) return;
  pRight = pExpr->pRight;
  pLeft = pExpr->pLeft;
  assert( pRight!=0 );
  assert( pLeft!=0 );
  if( pRight->op==TK_COLUMN
   && !ExprHasProperty(pRight, EP_FixedCol)
   && sqlite3ExprIsConstant(pLeft)
   && sqlite3IsBinary(sqlite3BinaryCompareCollSeq(pConst->pParse,pLeft,pRight))
  ){
    constInsert(pConst, pRight, pLeft);
  }else
  if( pLeft->op==TK_COLUMN
   && !ExprHasProperty(pLeft, EP_FixedCol)
   && sqlite3ExprIsConstant(pRight)
   && sqlite3IsBinary(sqlite3BinaryCompareCollSeq(pConst->pParse,pLeft,pRight))
  ){
    constInsert(pConst, pLeft, pRight);
  }
}